

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O2

cmArgumentParser<Arguments> * __thiscall
cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
::
Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
          (cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
           *this,static_string_view name,
          offset_in_Arguments_to_optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          member)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
             ::_M_manager;
  local_28._M_unused._M_member_pointer = member;
  ArgumentParser::Base::Bind((Base *)this,name.super_string_view,(KeywordAction *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return (cmArgumentParser<Arguments> *)this;
}

Assistant:

cmArgumentParser& Bind(cm::static_string_view name, T Result::*member)
  {
    this->Base::Bind(name, [member](Instance& instance) {
      instance.Bind(static_cast<Result*>(instance.Result)->*member);
    });
    return *this;
  }